

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

int zip_entry_close(zip_t *zip)

{
  mz_uint32 *pmVar1;
  mz_uint32 mVar2;
  mz_uint64 mVar3;
  char *__ptr;
  tdefl_status tVar4;
  mz_bool mVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  mz_uint8 mVar9;
  mz_uint64 mVar10;
  mz_uint16 mVar11;
  mz_uint64 in_stack_ffffffffffffffc8;
  mz_uint32 in_stack_ffffffffffffffd0;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  
  if (zip == (zip_t *)0x0) {
    return -1;
  }
  iVar8 = 0;
  if ((zip->archive).m_zip_mode != MZ_ZIP_MODE_READING) {
    if ((zip->level & 0xf) == 0) {
      mVar10 = (zip->entry).comp_size;
    }
    else {
      tVar4 = tdefl_compress_buffer(&(zip->entry).comp,"",0,TDEFL_FINISH);
      if (1 < (uint)tVar4) {
        iVar8 = -1;
        goto LAB_003a33f9;
      }
      mVar3 = (zip->entry).state.m_cur_archive_file_ofs;
      mVar10 = (zip->entry).state.m_comp_size;
      (zip->entry).comp_size = mVar10;
      (zip->entry).offset = mVar3;
      (zip->entry).method = 8;
    }
    sVar6 = strlen((zip->entry).name);
    iVar8 = -1;
    if ((mVar10 >> 0x20 == 0) && (*(int *)((long)&(zip->entry).offset + 4) == 0)) {
      mz_zip_time_t_to_dos_time((zip->entry).m_time,&dos_time,&dos_date);
      mVar10 = (zip->entry).uncomp_size;
      mVar3 = (zip->entry).comp_size;
      mVar2 = (zip->entry).uncomp_crc32;
      mVar11 = (zip->entry).method;
      builtin_memcpy((zip->entry).header,"PK\x03\x04",4);
      mVar9 = '\x14';
      if (mVar11 == 0) {
        mVar9 = '\0';
      }
      (zip->entry).header[4] = mVar9;
      (zip->entry).header[5] = '\0';
      (zip->entry).header[6] = '\0';
      (zip->entry).header[7] = '\0';
      (zip->entry).header[8] = (mz_uint8)mVar11;
      (zip->entry).header[9] = (mz_uint8)(mVar11 >> 8);
      (zip->entry).header[10] = (mz_uint8)dos_time;
      (zip->entry).header[0xb] = (mz_uint8)(dos_time >> 8);
      (zip->entry).header[0xc] = (mz_uint8)dos_date;
      (zip->entry).header[0xd] = (mz_uint8)(dos_date >> 8);
      (zip->entry).header[0xe] = (mz_uint8)mVar2;
      (zip->entry).header[0xf] = (mz_uint8)(mVar2 >> 8);
      (zip->entry).header[0x10] = (mz_uint8)(mVar2 >> 0x10);
      (zip->entry).header[0x11] = (mz_uint8)(mVar2 >> 0x18);
      (zip->entry).header[0x12] = (mz_uint8)mVar3;
      (zip->entry).header[0x13] = (mz_uint8)(mVar3 >> 8);
      (zip->entry).header[0x14] = (mz_uint8)(mVar3 >> 0x10);
      (zip->entry).header[0x15] = (mz_uint8)(mVar3 >> 0x18);
      (zip->entry).header[0x16] = (mz_uint8)mVar10;
      (zip->entry).header[0x17] = (mz_uint8)(mVar10 >> 8);
      (zip->entry).header[0x18] = (mz_uint8)(mVar10 >> 0x10);
      (zip->entry).header[0x19] = (mz_uint8)(mVar10 >> 0x18);
      (zip->entry).header[0x1a] = (mz_uint8)sVar6;
      (zip->entry).header[0x1b] = (mz_uint8)(sVar6 >> 8);
      (zip->entry).header[0x1c] = '\0';
      (zip->entry).header[0x1d] = '\0';
      mVar11 = 0x3382;
      sVar7 = (*(zip->archive).m_pWrite)
                        ((zip->archive).m_pIO_opaque,(zip->entry).header_offset,(zip->entry).header,
                         0x1e);
      if ((sVar7 == 0x1e) &&
         (mVar5 = mz_zip_writer_add_to_central_dir
                            (&zip->archive,(zip->entry).name,(mz_uint16)sVar6,"",0,
                             (void *)(zip->entry).uncomp_size,(mz_uint16)(zip->entry).comp_size,
                             (ulong)(zip->entry).uncomp_crc32,(ulong)(zip->entry).method,
                             (uint)dos_time,dos_date,(mz_uint16)(zip->entry).header_offset,
                             (mz_uint16)(zip->entry).external_attr,mVar11,in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffd0), mVar5 != 0)) {
        pmVar1 = &(zip->archive).m_total_files;
        *pmVar1 = *pmVar1 + 1;
        (zip->archive).m_archive_size = (zip->entry).offset;
        iVar8 = 0;
      }
    }
  }
LAB_003a33f9:
  (zip->entry).m_time = 0;
  __ptr = (zip->entry).name;
  if (__ptr != (char *)0x0) {
    free(__ptr);
    (zip->entry).name = (char *)0x0;
  }
  return iVar8;
}

Assistant:

int zip_entry_close(struct zip_t *zip) {
  mz_zip_archive *pzip = NULL;
  mz_uint level;
  tdefl_status done;
  mz_uint16 entrylen;
  mz_uint16 dos_time, dos_date;
  int status = -1;

  if (!zip) {
    // zip_t handler is not initialized
    goto cleanup;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode == MZ_ZIP_MODE_READING) {
    status = 0;
    goto cleanup;
  }

  level = zip->level & 0xF;
  if (level) {
    done = tdefl_compress_buffer(&(zip->entry.comp), "", 0, TDEFL_FINISH);
    if (done != TDEFL_STATUS_DONE && done != TDEFL_STATUS_OKAY) {
      // Cannot flush compressed buffer
      goto cleanup;
    }
    zip->entry.comp_size = zip->entry.state.m_comp_size;
    zip->entry.offset = zip->entry.state.m_cur_archive_file_ofs;
    zip->entry.method = MZ_DEFLATED;
  }

  entrylen = (mz_uint16)strlen(zip->entry.name);
  // no zip64 support yet
  if ((zip->entry.comp_size > 0xFFFFFFFF) || (zip->entry.offset > 0xFFFFFFFF)) {
    // No zip64 support, yet
    goto cleanup;
  }

  mz_zip_time_t_to_dos_time(zip->entry.m_time, &dos_time, &dos_date);
  if (!mz_zip_writer_create_local_dir_header(
          pzip, zip->entry.header, entrylen, 0, zip->entry.uncomp_size,
          zip->entry.comp_size, zip->entry.uncomp_crc32, zip->entry.method, 0,
          dos_time, dos_date)) {
    // Cannot create zip entry header
    goto cleanup;
  }

  if (pzip->m_pWrite(pzip->m_pIO_opaque, zip->entry.header_offset,
                     zip->entry.header,
                     sizeof(zip->entry.header)) != sizeof(zip->entry.header)) {
    // Cannot write zip entry header
    goto cleanup;
  }

  if (!mz_zip_writer_add_to_central_dir(
          pzip, zip->entry.name, entrylen, NULL, 0, "", 0,
          zip->entry.uncomp_size, zip->entry.comp_size, zip->entry.uncomp_crc32,
          zip->entry.method, 0, dos_time, dos_date, zip->entry.header_offset,
          zip->entry.external_attr)) {
    // Cannot write to zip central dir
    goto cleanup;
  }

  pzip->m_total_files++;
  pzip->m_archive_size = zip->entry.offset;
  status = 0;

cleanup:
  if (zip) {
    zip->entry.m_time = 0;
    CLEANUP(zip->entry.name);
  }
  return status;
}